

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcRun(void)

{
  int iVar1;
  undefined1 local_30 [8];
  TraceScope traceScope;
  nullres local_9;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    local_9 = '\0';
  }
  else {
    if (nullcRun::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcRun::token);
      if (iVar1 != 0) {
        nullcRun::token = NULLC::TraceGetToken("nullc","nullcRun");
        __cxa_guard_release(&nullcRun::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_30,nullcRun::token);
    local_9 = nullcRunFunction((char *)0x0);
    NULLC::TraceScope::~TraceScope((TraceScope *)local_30);
  }
  return local_9;
}

Assistant:

nullres	nullcRun()
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcRun");

#ifndef NULLC_NO_EXECUTOR
	return nullcRunFunction(NULL);
#else
	nullcLastError = "No executor available, compile library without NULLC_NO_EXECUTOR";
	return false;
#endif
}